

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O1

void duckdb_je_malloc_mutex_postfork_child(tsdn_t *tsdn,malloc_mutex_t *mutex)

{
  _Bool _Var1;
  malloc_mutex_lock_order_t in_ECX;
  witness_rank_t in_EDX;
  
  _Var1 = duckdb_je_malloc_mutex_init(mutex,(char *)mutex,in_EDX,in_ECX);
  if (_Var1) {
    duckdb_je_malloc_printf("<jemalloc>: Error re-initializing mutex in child\n");
    if (duckdb_je_opt_abort == true) {
      abort();
    }
  }
  return;
}

Assistant:

void
malloc_mutex_postfork_child(tsdn_t *tsdn, malloc_mutex_t *mutex) {
#ifdef JEMALLOC_MUTEX_INIT_CB
	malloc_mutex_unlock(tsdn, mutex);
#else
	if (malloc_mutex_init(mutex, mutex->witness.name,
	    mutex->witness.rank, mutex->lock_order)) {
		malloc_printf("<jemalloc>: Error re-initializing mutex in "
		    "child\n");
		if (opt_abort) {
			abort();
		}
	}
#endif
}